

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

void __thiscall ncnn::PriorBox::PriorBox(PriorBox *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffff70;
  
  Layer::Layer(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__PriorBox_01d3e5f8;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  *(undefined4 *)(in_RDI + 0x1d) = 0;
  in_RDI[0x1e] = 0;
  *(undefined4 *)(in_RDI + 0x1f) = 0;
  *(undefined4 *)((long)in_RDI + 0xfc) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)((long)in_RDI + 0x104) = 0;
  *(undefined4 *)(in_RDI + 0x21) = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  *(undefined4 *)(in_RDI + 0x26) = 0;
  in_RDI[0x27] = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)((long)in_RDI + 0x144) = 0;
  *(undefined4 *)(in_RDI + 0x29) = 0;
  *(undefined4 *)((long)in_RDI + 0x14c) = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  *(undefined4 *)(in_RDI + 0x2f) = 0;
  in_RDI[0x30] = 0;
  *(undefined4 *)(in_RDI + 0x31) = 0;
  *(undefined4 *)((long)in_RDI + 0x18c) = 0;
  *(undefined4 *)(in_RDI + 0x32) = 0;
  *(undefined4 *)((long)in_RDI + 0x194) = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  in_RDI[0x34] = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

PriorBox::PriorBox()
{
    one_blob_only = false;
    support_inplace = false;
}